

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

size_t mi_debug_show_bitmap
                 (char *prefix,char *header,size_t block_count,mi_bitmap_field_t *fields,
                 size_t field_count)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 uVar3;
  long lVar4;
  size_t sVar5;
  mi_bitmap_field_t *pmVar6;
  bool bVar7;
  char buf [65];
  undefined1 local_78 [64];
  undefined1 local_38;
  
  sVar5 = 0;
  _mi_message("%s%s:\n","  ",prefix);
  if (fields != (mi_bitmap_field_t *)0x0) {
    lVar4 = 0;
    sVar5 = 0;
    pmVar6 = (mi_bitmap_field_t *)0x0;
    do {
      uVar1 = *(ulong *)(block_count + (long)pmVar6 * 8);
      uVar2 = 0;
      do {
        uVar3 = 0x20;
        if ((char *)(uVar2 + lVar4) < header) {
          bVar7 = (uVar1 >> (uVar2 & 0x3f) & 1) != 0;
          uVar3 = 0x2e;
          if (bVar7) {
            uVar3 = 0x78;
          }
          sVar5 = sVar5 + bVar7;
        }
        local_78[uVar2] = uVar3;
        uVar2 = uVar2 + 1;
      } while (uVar2 != 0x40);
      lVar4 = lVar4 + 0x40;
      local_38 = 0;
      _mi_message("%s  %s\n","  ",local_78);
      pmVar6 = (mi_bitmap_field_t *)((long)pmVar6 + 1);
    } while (pmVar6 != fields);
  }
  _mi_message("%s  total (\'x\'): %zu\n","  ",sVar5);
  return sVar5;
}

Assistant:

static size_t mi_debug_show_bitmap(const char* prefix, const char* header, size_t block_count, mi_bitmap_field_t* fields, size_t field_count ) {
  _mi_message("%s%s:\n", prefix, header);
  size_t bcount = 0;
  size_t inuse_count = 0;
  for (size_t i = 0; i < field_count; i++) {
    char buf[MI_BITMAP_FIELD_BITS + 1];
    uintptr_t field = mi_atomic_load_relaxed(&fields[i]);
    for (size_t bit = 0; bit < MI_BITMAP_FIELD_BITS; bit++, bcount++) {
      if (bcount < block_count) {
        bool inuse = ((((uintptr_t)1 << bit) & field) != 0);
        if (inuse) inuse_count++;
        buf[bit] = (inuse ? 'x' : '.');
      }
      else {
        buf[bit] = ' ';
      }
    }
    buf[MI_BITMAP_FIELD_BITS] = 0;
    _mi_message("%s  %s\n", prefix, buf);
  }
  _mi_message("%s  total ('x'): %zu\n", prefix, inuse_count);
  return inuse_count;
}